

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkEvolve(ARKodeMem ark_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  int *nflagPtr;
  int iVar1;
  ARKodeRootMem pAVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  realtype rVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  realtype dsm;
  int constrfails;
  int nef;
  int ncf;
  int nflag;
  int local_54;
  realtype local_50;
  realtype local_48;
  int local_40 [4];
  
  if (ark_mem == (ARKodeMem)0x0) {
    pcVar7 = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    iVar5 = -0x15;
  }
  else {
    if (ark_mem->MallocDone == 0) {
      pcVar7 = "Attempt to call before ARKodeInit.";
      iVar3 = -0x17;
      iVar5 = -0x17;
      goto LAB_003eb764;
    }
    ark_mem->ycur = yout;
    if (yout == (N_Vector)0x0) {
      pcVar7 = "yout = NULL illegal.";
    }
    else if (tret == (realtype *)0x0) {
      pcVar7 = "tret = NULL illegal.";
    }
    else {
      if (0xfffffffd < itask - 3U) {
        pAVar2 = ark_mem->root_mem;
        if (pAVar2 != (ARKodeRootMem)0x0) {
          if (itask == 1) {
            pAVar2->toutc = tout;
          }
          pAVar2->taskc = itask;
        }
        iVar3 = local_54;
        local_50 = tout;
        if (ark_mem->initsetup != 0) {
          rVar9 = ark_mem->tcur;
          *tret = rVar9;
          ark_mem->tretlast = rVar9;
          iVar3 = arkInitialSetup(ark_mem,tout);
          if (iVar3 != 0) {
            return iVar3;
          }
          local_54 = 0;
          iVar3 = 0;
          if (ark_mem->initsetup != 0) goto LAB_003eb80b;
        }
        local_54 = iVar3;
        iVar3 = arkStopTests(ark_mem,local_50,yout,tret,itask,&local_54);
        if (iVar3 != 0) {
          return local_54;
        }
LAB_003eb80b:
        nflagPtr = local_40 + 3;
        lVar8 = 0;
        do {
          ark_mem->next_h = ark_mem->h;
          if (ark_mem->initsetup == 0) {
            iVar3 = (*ark_mem->efun)(ark_mem->yn,ark_mem->ewt,ark_mem->e_data);
            if (iVar3 == 0) {
              if ((ark_mem->rwt_is_ewt != 0) ||
                 (iVar3 = (*ark_mem->rfun)(ark_mem->yn,ark_mem->rwt,ark_mem->r_data), iVar3 == 0))
              goto LAB_003eb86f;
              iVar3 = ark_mem->itol;
              rVar9 = ark_mem->tcur;
              pcVar4 = "At t = %lg, the user-provide RwtSet function failed.";
              pcVar7 = "At t = %lg, a component of rwt has become <= 0.";
            }
            else {
              iVar3 = ark_mem->itol;
              rVar9 = ark_mem->tcur;
              pcVar4 = "At t = %lg, the user-provide EwtSet function failed.";
              pcVar7 = "At t = %lg, a component of ewt has become <= 0.";
            }
            if (iVar3 == 2) {
              pcVar7 = pcVar4;
            }
            iVar3 = -0x16;
            iVar5 = -0x16;
LAB_003ebf70:
            arkProcessError(ark_mem,iVar5,"ARKode","arkEvolve",pcVar7,rVar9);
LAB_003ebd69:
            rVar9 = ark_mem->tcur;
            *tret = rVar9;
            ark_mem->tretlast = rVar9;
            N_VScale(1.0,ark_mem->yn,yout);
            return iVar3;
          }
LAB_003eb86f:
          if (ark_mem->mxstep <= lVar8 && 0 < ark_mem->mxstep) {
            rVar9 = ark_mem->tcur;
            pcVar7 = "At t = %lg, mxstep steps taken before reaching tout.";
            iVar3 = -1;
            iVar5 = -1;
            goto LAB_003ebf70;
          }
          rVar9 = N_VWrmsNorm(ark_mem->yn,ark_mem->ewt);
          dVar10 = rVar9 * ark_mem->uround;
          ark_mem->tolsf = dVar10;
          if (1.0 < dVar10) {
            arkProcessError(ark_mem,-2,"ARKode","arkEvolve",
                            "At t = %lg, too much accuracy requested.",ark_mem->tcur);
            rVar9 = ark_mem->tcur;
            *tret = rVar9;
            ark_mem->tretlast = rVar9;
            N_VScale(1.0,ark_mem->yn,yout);
            ark_mem->tolsf = ark_mem->tolsf + ark_mem->tolsf;
            return -2;
          }
          ark_mem->tolsf = 1.0;
          dVar10 = ark_mem->tcur;
          dVar11 = dVar10 + ark_mem->h;
          if ((dVar11 == dVar10) && (!NAN(dVar11) && !NAN(dVar10))) {
            iVar5 = ark_mem->mxhnil;
            iVar1 = ark_mem->nhnil;
            iVar3 = iVar1 + 1;
            ark_mem->nhnil = iVar3;
            if (iVar1 < iVar5) {
              arkProcessError(ark_mem,99,"ARKode","arkEvolve",
                              "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                             );
              iVar5 = ark_mem->mxhnil;
              iVar3 = ark_mem->nhnil;
            }
            if (iVar3 == iVar5) {
              arkProcessError(ark_mem,99,"ARKode","arkEvolve",
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          dVar10 = ark_mem->h;
          if ((ark_mem->hprime != dVar10) || (NAN(ark_mem->hprime) || NAN(dVar10))) {
            dVar10 = dVar10 * ark_mem->eta;
            ark_mem->h = dVar10;
            ark_mem->next_h = dVar10;
          }
          if (ark_mem->fixedstep != 0) {
            dVar10 = ark_mem->hin;
            ark_mem->h = dVar10;
            ark_mem->next_h = dVar10;
            if (ark_mem->tstopset != 0) {
              if (0.0 < ((dVar10 + ark_mem->tcur) - ark_mem->tstop) * dVar10) {
                ark_mem->h = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - ark_mem->tcur);
              }
            }
          }
          local_48 = 0.0;
          ark_mem->last_kflag = 0;
          local_40[0] = 0;
          local_40[1] = 0;
          local_40[2] = 0;
          local_40[3] = 6;
          while( true ) {
            ark_mem->nst_attempts = ark_mem->nst_attempts + 1;
            iVar3 = (*ark_mem->step)(ark_mem,&local_48,nflagPtr);
            if (iVar3 < 0) goto LAB_003ebd5d;
            iVar3 = arkCheckConvergence(ark_mem,nflagPtr,local_40 + 2);
            if ((iVar3 < 0) ||
               (((iVar3 == 0 && (ark_mem->constraintsSet != 0)) &&
                (iVar3 = arkCheckConstraints(ark_mem,local_40,nflagPtr), iVar3 < 0))))
            goto LAB_003ebd5d;
            if (ark_mem->fixedstep != 0) break;
            if ((iVar3 == 0) &&
               (iVar3 = arkCheckTemporalError(ark_mem,nflagPtr,local_40 + 1,local_48), iVar3 < 0))
            goto LAB_003ebd5d;
            dVar10 = ark_mem->hadapt_mem->etamax;
            dVar11 = ark_mem->eta;
            if (dVar10 <= ark_mem->eta) {
              dVar11 = dVar10;
            }
            dVar10 = ABS(ark_mem->h);
            dVar12 = ark_mem->hmin / dVar10;
            if (dVar11 <= dVar12) {
              dVar11 = dVar12;
            }
            dVar13 = ark_mem->hmax_inv * dVar10 * dVar11;
            dVar12 = 1.0;
            if (1.0 <= dVar13) {
              dVar12 = dVar13;
            }
            ark_mem->eta = dVar11 / dVar12;
            if (ark_mem->force_pass != 0) {
              ark_mem->last_kflag = iVar3;
              goto LAB_003ebb75;
            }
            if (iVar3 == 0) goto LAB_003ebb75;
            if (dVar10 <= ark_mem->hmin * 1.000001) {
              return -3;
            }
            dVar10 = ark_mem->h * (dVar11 / dVar12);
            ark_mem->h = dVar10;
            ark_mem->hprime = dVar10;
            ark_mem->next_h = dVar10;
          }
          ark_mem->eta = 1.0;
          if (iVar3 != 0) goto LAB_003ebd5d;
LAB_003ebb75:
          iVar3 = arkCompleteStep(ark_mem,local_48);
          if (iVar3 != 0) {
LAB_003ebd5d:
            iVar3 = arkHandleFailure(ark_mem,iVar3);
            goto LAB_003ebd69;
          }
          if ((ark_mem->root_mem != (ARKodeRootMem)0x0) && (0 < ark_mem->root_mem->nrtfn)) {
            iVar3 = arkRootCheck3(ark_mem);
            if (iVar3 == -0xc) {
              arkProcessError(ark_mem,-0xc,"ARKode","arkEvolve",
                              "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                              ,ark_mem->root_mem->tlo);
              return -0xc;
            }
            if (iVar3 == 1) {
              pAVar2 = ark_mem->root_mem;
              pAVar2->irfnd = 1;
              rVar9 = pAVar2->tlo;
              *tret = rVar9;
              ark_mem->tretlast = rVar9;
              return 2;
            }
            if (ark_mem->nst == 1) {
              pAVar2 = ark_mem->root_mem;
              if (0 < (long)pAVar2->nrtfn) {
                lVar6 = 0;
                do {
                  if (pAVar2->gactive[lVar6] == 0) {
                    if (0 < pAVar2->mxgnull) {
                      arkProcessError(ark_mem,99,"ARKode","arkEvolve",
                                      "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                                     );
                    }
                    break;
                  }
                  lVar6 = lVar6 + 1;
                } while (pAVar2->nrtfn != lVar6);
              }
            }
          }
          if ((itask == 1) && (0.0 <= (ark_mem->tcur - local_50) * ark_mem->h)) {
            *tret = local_50;
            ark_mem->tretlast = local_50;
            arkGetDky(ark_mem,local_50,0,yout);
            ark_mem->next_h = ark_mem->hprime;
            return 0;
          }
          if (ark_mem->tstopset != 0) {
            dVar10 = ark_mem->tstop;
            dVar11 = ark_mem->tcur;
            dVar12 = ark_mem->h;
            if (ABS(dVar11 - dVar10) <= (ABS(dVar12) + ABS(dVar11)) * ark_mem->uround * 100.0) {
              arkGetDky(ark_mem,dVar10,0,yout);
              rVar9 = ark_mem->tstop;
              *tret = rVar9;
              ark_mem->tretlast = rVar9;
              ark_mem->tstopset = 0;
              return 1;
            }
            if (0.0 < ((ark_mem->hprime + dVar11) - dVar10) * dVar12) {
              dVar10 = (ark_mem->uround * -4.0 + 1.0) * (dVar10 - dVar11);
              ark_mem->hprime = dVar10;
              ark_mem->eta = dVar10 / dVar12;
            }
          }
          lVar8 = lVar8 + 1;
          if (itask == 2) {
            rVar9 = ark_mem->tcur;
            *tret = rVar9;
            ark_mem->tretlast = rVar9;
            N_VScale(1.0,ark_mem->yn,yout);
            ark_mem->next_h = ark_mem->hprime;
            return 0;
          }
        } while( true );
      }
      pcVar7 = "Illegal value for itask.";
    }
    iVar3 = -0x16;
    iVar5 = -0x16;
  }
LAB_003eb764:
  arkProcessError(ark_mem,iVar5,"ARKode","arkEvolve",pcVar7);
  return iVar3;
}

Assistant:

int arkEvolve(ARKodeMem ark_mem, realtype tout, N_Vector yout,
              realtype *tret, int itask)
{
  long int nstloc;
  int retval, kflag, istate, ir;
  int ewtsetOK;
  realtype troundoff, nrm;
  booleantype inactive_roots;
  realtype dsm;
  int nflag, attempts, ncf, nef, constrfails;

  /* Check and process inputs */

  /* Check if ark_mem exists */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode", "arkEvolve",
                    MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode", "arkEvolve",
                    MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((ark_mem->ycur = yout) == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_YOUT_NULL);
    return(ARK_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_TRET_NULL);
    return(ARK_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != ARK_NORMAL) && (itask != ARK_ONE_STEP) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_BAD_ITASK);
    return(ARK_ILL_INPUT);
  }

  /* store copy of itask if using root-finding */
  if (ark_mem->root_mem != NULL) {
    if (itask == ARK_NORMAL) ark_mem->root_mem->toutc = tout;
    ark_mem->root_mem->taskc = itask;
  }


  /* perform first-step-specific initializations:
     - initialize tret values to initialization time
     - perform initial integrator setup  */
  if (ark_mem->initsetup) {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    retval = arkInitialSetup(ark_mem, tout);
    if (retval!= ARK_SUCCESS) return(retval);
  }

  /* perform stopping tests */
  if (!ark_mem->initsetup)
    if (arkStopTests(ark_mem, tout, yout, tret, itask, &retval))
      return(retval);


  /*--------------------------------------------------
    Looping point for successful internal steps

    - update the ewt/rwt vectors for upcoming step
    - check for errors (too many steps, too much
      accuracy requested, step size too small)
    - loop over attempts at a new step:
      * try to take step (via time stepper module),
        handle solver convergence or other failures
      * perform constraint-handling (if selected)
      * check temporal error
      * if all of the above pass, complete step by
        updating current time, solution, error &
        stepsize history arrays.
    - perform stop tests:
      * check for root in last step taken
      * check if tout was passed
      * check if close to tstop
      * check if in ONE_STEP mode (must return)
    --------------------------------------------------*/
  nstloc = 0;
  for(;;) {

    ark_mem->next_h = ark_mem->h;

    /* Reset and check ewt and rwt */
    if (!ark_mem->initsetup) {

      ewtsetOK = ark_mem->efun(ark_mem->yn,
                               ark_mem->ewt,
                               ark_mem->e_data);
      if (ewtsetOK != 0) {
        if (ark_mem->itol == ARK_WF)
          arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                          MSG_ARK_EWT_NOW_FAIL, ark_mem->tcur);
        else
          arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                          MSG_ARK_EWT_NOW_BAD, ark_mem->tcur);

        istate = ARK_ILL_INPUT;
        ark_mem->tretlast = *tret = ark_mem->tcur;
        N_VScale(ONE, ark_mem->yn, yout);
        break;
      }

      if (!ark_mem->rwt_is_ewt) {
        ewtsetOK = ark_mem->rfun(ark_mem->yn,
                                 ark_mem->rwt,
                                 ark_mem->r_data);
        if (ewtsetOK != 0) {
          if (ark_mem->itol == ARK_WF)
            arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                            MSG_ARK_RWT_NOW_FAIL, ark_mem->tcur);
          else
            arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                            MSG_ARK_RWT_NOW_BAD, ark_mem->tcur);

          istate = ARK_ILL_INPUT;
          ark_mem->tretlast = *tret = ark_mem->tcur;
          N_VScale(ONE, ark_mem->yn, yout);
          break;
        }
      }
    }

    /* Check for too many steps */
    if ( (ark_mem->mxstep > 0) && (nstloc >= ark_mem->mxstep) ) {
      arkProcessError(ark_mem, ARK_TOO_MUCH_WORK, "ARKode", "arkEvolve",
                      MSG_ARK_MAX_STEPS, ark_mem->tcur);
      istate = ARK_TOO_MUCH_WORK;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(ark_mem->yn, ark_mem->ewt);
    ark_mem->tolsf = ark_mem->uround * nrm;
    if (ark_mem->tolsf > ONE) {
      arkProcessError(ark_mem, ARK_TOO_MUCH_ACC, "ARKode", "arkEvolve",
                      MSG_ARK_TOO_MUCH_ACC, ark_mem->tcur);
      istate = ARK_TOO_MUCH_ACC;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tolsf *= TWO;
      break;
    } else {
      ark_mem->tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (ark_mem->tcur + ark_mem->h == ark_mem->tcur) {
      ark_mem->nhnil++;
      if (ark_mem->nhnil <= ark_mem->mxhnil)
        arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                        MSG_ARK_HNIL, ark_mem->tcur, ark_mem->h);
      if (ark_mem->nhnil == ark_mem->mxhnil)
        arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                        MSG_ARK_HNIL_DONE);
    }

    /* Update parameter for upcoming step size */
    if (ark_mem->hprime != ark_mem->h) {
      ark_mem->h = ark_mem->h * ark_mem->eta;
      ark_mem->next_h = ark_mem->h;
    }
    if (ark_mem->fixedstep) {
      ark_mem->h = ark_mem->hin;
      ark_mem->next_h = ark_mem->h;

      /* patch for 'fixedstep' + 'tstop' use case: 
         limit fixed step size if step would overtake tstop */
      if ( ark_mem->tstopset ) {
        if ( (ark_mem->tcur + ark_mem->h - ark_mem->tstop)*ark_mem->h > ZERO ) {
          ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
            (ONE-FOUR*ark_mem->uround);
        }
      }
    }

    /* Looping point for step attempts */
    dsm = ZERO;
    attempts = ncf = nef = constrfails = ark_mem->last_kflag = 0;
    nflag = FIRST_CALL;
    for(;;) {

      /* increment attempt counters */
      attempts++;
      ark_mem->nst_attempts++;

#ifdef SUNDIALS_DEBUG
      printf("ARKODE start step %li,  attempt %i,  h = %"RSYM",  t_n = %"RSYM"\n",
             ark_mem->nst, attempts, ark_mem->h, ark_mem->tcur);
#endif

      /* Call time stepper module to attempt a step:
            0 => step completed successfully
           >0 => step encountered recoverable failure; reduce step if possible
           <0 => step encountered unrecoverable failure */
      kflag = ark_mem->step((void*) ark_mem, &dsm, &nflag);
      if (kflag < 0)  break;

      /* handle solver convergence failures */
      kflag = arkCheckConvergence(ark_mem, &nflag, &ncf);
      if (kflag < 0)  break;

      /* perform constraint-handling (if selected, and if solver check passed) */
      if (ark_mem->constraintsSet && (kflag == ARK_SUCCESS)) {
        kflag = arkCheckConstraints(ark_mem, &constrfails, &nflag);
        if (kflag < 0)  break;
      }

      /* when fixed time-stepping is enabled, 'success' == successful stage solves
         (checked in previous block), so just enforce no step size change */
      if (ark_mem->fixedstep) {
        ark_mem->eta = ONE;
        break;
      }

      /* check temporal error (if checks above passed) */
      if (kflag == ARK_SUCCESS) {
        kflag = arkCheckTemporalError(ark_mem, &nflag, &nef, dsm);
        if (kflag < 0)  break;
      }

      /* if we've made it here then no nonrecoverable failures occurred; someone above
         has recommended an 'eta' value for the next step -- enforce bounds on that value
         and set upcoming step size */
      ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
      ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
      ark_mem->eta /= SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv*ark_mem->eta);

      /* if ignoring temporal error test result (XBraid) force step to pass */
      if (ark_mem->force_pass) {
        ark_mem->last_kflag = kflag;
        kflag = ARK_SUCCESS;
        break;
      }

      /* break attempt loop on successful step */
      if (kflag == ARK_SUCCESS)  break;

      /* unsuccessful step, if |h| = hmin, return ARK_ERR_FAILURE */
      if (SUNRabs(ark_mem->h) <= ark_mem->hmin*ONEPSM) return(ARK_ERR_FAILURE);

      /* update h, hprime and next_h for next iteration */
      ark_mem->h *= ark_mem->eta;
      ark_mem->next_h = ark_mem->hprime = ark_mem->h;

    } /* end looping for step attempts */

    /* If step attempt loop succeeded, complete step (update current time, solution,
       error stepsize history arrays; call user-supplied step postprocessing function)
       (added stuff from arkStep_PrepareNextStep -- revisit) */
    if (kflag == ARK_SUCCESS)  kflag = arkCompleteStep(ark_mem, dsm);

    /* If step attempt loop failed, process flag and return to user */
    if (kflag != ARK_SUCCESS) {
      istate = arkHandleFailure(ark_mem, kflag);
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    nstloc++;

    /* Check for root in last step taken. */
    if (ark_mem->root_mem != NULL) {
      if (ark_mem->root_mem->nrtfn > 0) {

        retval = arkRootCheck3((void*) ark_mem);
        if (retval == RTFOUND) {  /* A new root was found */
          ark_mem->root_mem->irfnd = 1;
          istate = ARK_ROOT_RETURN;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          break;
        } else if (retval == ARK_RTFUNC_FAIL) { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkEvolve",
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          istate = ARK_RTFUNC_FAIL;
          break;
        }

        /* If we are at the end of the first step and we still have
           some event functions that are inactive, issue a warning
           as this may indicate a user error in the implementation
           of the root function. */
        if (ark_mem->nst==1) {
          inactive_roots = SUNFALSE;
          for (ir=0; ir<ark_mem->root_mem->nrtfn; ir++) {
            if (!ark_mem->root_mem->gactive[ir]) {
              inactive_roots = SUNTRUE;
              break;
            }
          }
          if ((ark_mem->root_mem->mxgnull > 0) && inactive_roots) {
            arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                            MSG_ARK_INACTIVE_ROOTS);
          }
        }
      }
    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == ARK_NORMAL) &&
         (ark_mem->tcur-tout)*ark_mem->h >= ZERO ) {
      istate = ARK_SUCCESS;
      ark_mem->tretlast = *tret = tout;
      (void) arkGetDky(ark_mem, tout, 0, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( ark_mem->tstopset ) {
      troundoff = FUZZ_FACTOR*ark_mem->uround *
        (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
      if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff) {
        (void) arkGetDky(ark_mem, ark_mem->tstop, 0, yout);
        ark_mem->tretlast = *tret = ark_mem->tstop;
        ark_mem->tstopset = SUNFALSE;
        istate = ARK_TSTOP_RETURN;
        break;
      }
      /* limit upcoming step if it will overcome tstop */
      if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
          (ONE-FOUR*ark_mem->uround);
        ark_mem->eta = ark_mem->hprime/ark_mem->h;
      }
    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == ARK_ONE_STEP) {
      istate = ARK_SUCCESS;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

  } /* end looping for internal steps */

  return(istate);
}